

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

int ShowDemoWindowWidgets::Funcs::MyCallback(ImGuiInputTextCallbackData *data)

{
  char cVar1;
  int *p_int;
  char c;
  ImGuiInputTextCallbackData *data_local;
  
  if (data->EventFlag == 0x40) {
    ImGuiInputTextCallbackData::InsertChars(data,data->CursorPos,"..",(char *)0x0);
  }
  else if (data->EventFlag == 0x80) {
    if (data->EventKey == 0x203) {
      ImGuiInputTextCallbackData::DeleteChars(data,0,data->BufTextLen);
      ImGuiInputTextCallbackData::InsertChars(data,0,"Pressed Up!",(char *)0x0);
      ImGuiInputTextCallbackData::SelectAll(data);
    }
    else if (data->EventKey == 0x204) {
      ImGuiInputTextCallbackData::DeleteChars(data,0,data->BufTextLen);
      ImGuiInputTextCallbackData::InsertChars(data,0,"Pressed Down!",(char *)0x0);
      ImGuiInputTextCallbackData::SelectAll(data);
    }
  }
  else if (data->EventFlag == 0x80000) {
    cVar1 = *data->Buf;
    if ((('`' < cVar1) && (cVar1 < '{')) || (('@' < cVar1 && (cVar1 < '[')))) {
      *data->Buf = *data->Buf ^ 0x20;
    }
    data->BufDirty = true;
    *(int *)data->UserData = *data->UserData + 1;
  }
  return 0;
}

Assistant:

static int MyCallback(ImGuiInputTextCallbackData* data)
                {
                    if (data->EventFlag == ImGuiInputTextFlags_CallbackCompletion)
                    {
                        data->InsertChars(data->CursorPos, "..");
                    }
                    else if (data->EventFlag == ImGuiInputTextFlags_CallbackHistory)
                    {
                        if (data->EventKey == ImGuiKey_UpArrow)
                        {
                            data->DeleteChars(0, data->BufTextLen);
                            data->InsertChars(0, "Pressed Up!");
                            data->SelectAll();
                        }
                        else if (data->EventKey == ImGuiKey_DownArrow)
                        {
                            data->DeleteChars(0, data->BufTextLen);
                            data->InsertChars(0, "Pressed Down!");
                            data->SelectAll();
                        }
                    }
                    else if (data->EventFlag == ImGuiInputTextFlags_CallbackEdit)
                    {
                        // Toggle casing of first character
                        char c = data->Buf[0];
                        if ((c >= 'a' && c <= 'z') || (c >= 'A' && c <= 'Z')) data->Buf[0] ^= 32;
                        data->BufDirty = true;

                        // Increment a counter
                        int* p_int = (int*)data->UserData;
                        *p_int = *p_int + 1;
                    }
                    return 0;
                }